

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O0

rtosc_arg_val_t *
rtosc_arg_val_range_arg(rtosc_arg_val_t *range_arg,int ith,rtosc_arg_val_t *result)

{
  rtosc_arg_val_t *in_RDX;
  int in_ESI;
  long in_RDI;
  int ok;
  rtosc_arg_val_t mult;
  rtosc_arg_val_t n_as_arg_val;
  rtosc_arg_val_t *local_58;
  int local_4c;
  rtosc_arg_val_t local_48;
  rtosc_arg_val_t local_30;
  rtosc_arg_val_t *local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_4c = rtosc_arg_val_from_int(&local_30,*(char *)(in_RDI + 0x18),in_ESI);
  if (local_4c != 0) {
    local_4c = rtosc_arg_val_mult(&local_30,(rtosc_arg_val_t *)(local_8 + 0x18),&local_48);
  }
  if (local_4c != 0) {
    local_4c = rtosc_arg_val_add((rtosc_arg_val_t *)(local_8 + 0x30),&local_48,local_18);
  }
  if (local_4c == 0) {
    local_58 = (rtosc_arg_val_t *)0x0;
  }
  else {
    local_58 = local_18;
  }
  return local_58;
}

Assistant:

rtosc_arg_val_t* rtosc_arg_val_range_arg(const rtosc_arg_val_t *range_arg,
                                         int ith, rtosc_arg_val_t* result)
{
    rtosc_arg_val_t n_as_arg_val, mult;
    int ok = 1;
    if(ok) ok = rtosc_arg_val_from_int(&n_as_arg_val, range_arg[1].type, ith);
    if(ok) ok = rtosc_arg_val_mult(&n_as_arg_val, range_arg+1, &mult);
    if(ok) ok = rtosc_arg_val_add(range_arg+2, &mult, result);
    return ok ? result : NULL;
}